

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

NodeSequence __thiscall
GraphBuilder::insertPthreadCreate(GraphBuilder *this,CallInst *callInstruction)

{
  NodeSequence NVar1;
  bool bVar2;
  Function *pFVar3;
  ForkNode *calledValue;
  Value *PTA;
  iterator this_00;
  reference ppFVar4;
  CallInst *in_RDI;
  NodeSequence graph;
  Function *function;
  iterator __end1;
  iterator __begin1;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range1;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> functionsToBeForked;
  Value *possibleFunction;
  ForkNode *forkNode;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  NodeSequence in_stack_ffffffffffffff88;
  Node *this_01;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  local_58;
  EntryNode *entryNode;
  ForkNode *in_stack_ffffffffffffffb8;
  ForkNode *in_stack_fffffffffffffff0;
  GraphBuilder *in_stack_fffffffffffffff8;
  
  pFVar3 = llvm::CallBase::getCalledFunction((CallBase *)in_stack_ffffffffffffff88.first);
  if (pFVar3 == (Function *)0x0) {
    createNode<(NodeType)1,decltype(nullptr),llvm::CallInst_const*>
              (in_RDI,(CallInst *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    calledValue = addNode<ForkNode>(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
  }
  else {
    createNode<(NodeType)1,llvm::CallInst_const*>(in_RDI);
    calledValue = addNode<ForkNode>(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
  }
  PTA = llvm::CallBase::getArgOperand((CallBase *)in_RDI,in_stack_ffffffffffffff7c);
  dg::getCalledFunctions((Value *)calledValue,(LLVMPointerAnalysis *)PTA);
  entryNode = (EntryNode *)&stack0xffffffffffffffb8;
  local_58._M_current =
       (Function **)
       std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin
                 ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  this_00 = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end
                      ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while( true ) {
    this_01 = in_stack_ffffffffffffff88.second;
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar2) break;
    ppFVar4 = __gnu_cxx::
              __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
              ::operator*(&local_58);
    in_stack_ffffffffffffff88 = createOrGetFunction((GraphBuilder *)this_00._M_current,*ppFVar4);
    if (in_stack_ffffffffffffff88.first != (Node *)0x0) {
      ForkNode::addForkSuccessor(in_stack_ffffffffffffffb8,entryNode);
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
    ::operator++(&local_58);
  }
  std::pair<Node_*,_Node_*>::pair<ForkNode_*&,_ForkNode_*&,_true>
            ((pair<Node_*,_Node_*> *)&stack0xfffffffffffffff0,(ForkNode **)&stack0xffffffffffffffd8,
             (ForkNode **)&stack0xffffffffffffffd8);
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)this_01);
  NVar1.second = (Node *)in_stack_fffffffffffffff8;
  NVar1.first = &in_stack_fffffffffffffff0->super_Node;
  return NVar1;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadCreate(const CallInst *callInstruction) {
    ForkNode *forkNode;
    if (callInstruction->getCalledFunction()) {
        forkNode = addNode(createNode<NodeType::FORK>(callInstruction));
    } else {
        forkNode =
                addNode(createNode<NodeType::FORK>(nullptr, callInstruction));
    }
    auto *possibleFunction = callInstruction->getArgOperand(2);
    auto functionsToBeForked =
            getCalledFunctions(possibleFunction, pointsToAnalysis_);
    for (const auto *function : functionsToBeForked) {
        auto graph = createOrGetFunction(function);
        if (graph.first) {
            forkNode->addForkSuccessor(static_cast<EntryNode *>(graph.first));
        }
    }
    return {forkNode, forkNode};
}